

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O3

double TTA::Alloc(uint max_length,PerformanceEvaluator *perf)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  uint *__s;
  uint *__s_00;
  uint *__s_01;
  ulong __n;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  lVar4 = cv::getTickCount();
  (perf->counter_).last = (double)lVar4;
  __n = (ulong)max_length << 2;
  __s = (uint *)operator_new__(__n);
  rtable_ = __s;
  __s_00 = (uint *)operator_new__(__n);
  next_ = __s_00;
  __s_01 = (uint *)operator_new__(__n);
  tail_ = __s_01;
  memset(__s,0,__n);
  memset(__s_00,0,__n);
  memset(__s_01,0,__n);
  lVar4 = cv::getTickCount();
  dVar3 = perf->tick_frequency_;
  dVar1 = (double)lVar4 - (perf->counter_).last;
  (perf->counter_).last = dVar1;
  (perf->counter_).total = (perf->counter_).total + dVar1;
  lVar4 = cv::getTickCount();
  (perf->counter_).last = (double)lVar4;
  memset(rtable_,0,__n);
  memset(next_,0,__n);
  memset(tail_,0,__n);
  lVar4 = cv::getTickCount();
  dVar2 = (double)lVar4 - (perf->counter_).last;
  (perf->counter_).last = dVar2;
  auVar5._0_8_ = dVar1 * 1000.0;
  auVar5._8_8_ = dVar2 * 1000.0;
  (perf->counter_).total = dVar2 + (perf->counter_).total;
  auVar6._8_4_ = SUB84(perf->tick_frequency_,0);
  auVar6._0_8_ = dVar3;
  auVar6._12_4_ = (int)((ulong)perf->tick_frequency_ >> 0x20);
  auVar6 = divpd(auVar5,auVar6);
  return auVar6._0_8_ - auVar6._8_8_;
}

Assistant:

static double Alloc(unsigned max_length, PerformanceEvaluator& perf) {
        perf.start();
        rtable_ = new unsigned[max_length];
        next_ = new unsigned[max_length];
        tail_ = new unsigned[max_length];
        memset(rtable_, 0, max_length * sizeof(unsigned));
        memset(next_, 0, max_length * sizeof(unsigned));
        memset(tail_, 0, max_length * sizeof(unsigned));
        perf.stop();
        double t = perf.last();
        perf.start();
        memset(rtable_, 0, max_length * sizeof(unsigned));
        memset(next_, 0, max_length * sizeof(unsigned));
        memset(tail_, 0, max_length * sizeof(unsigned));
        perf.stop();
        return t - perf.last();
    }